

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUIFileOpenDialog::sendSelectedEvent(CGUIFileOpenDialog *this,EGUI_EVENT_TYPE type)

{
  SEvent event;
  undefined4 local_38 [2];
  CGUIFileOpenDialog *local_30;
  undefined8 local_28;
  EGUI_EVENT_TYPE local_20;
  
  local_38[0] = 0;
  local_28 = 0;
  local_30 = this;
  local_20 = type;
  (**(code **)(**(long **)&this->field_0x20 + 0x10))(*(long **)&this->field_0x20,local_38);
  return;
}

Assistant:

void CGUIFileOpenDialog::sendSelectedEvent(EGUI_EVENT_TYPE type)
{
	SEvent event;
	event.EventType = EET_GUI_EVENT;
	event.GUIEvent.Caller = this;
	event.GUIEvent.Element = 0;
	event.GUIEvent.EventType = type;
	Parent->OnEvent(event);
}